

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool (anonymous_namespace)::readWaveform<float,short>
               (ifstream *fin,TWaveformT<short> *res,int32_t offset,streamsize size)

{
  pointer psVar1;
  undefined1 extraout_AL;
  long lVar2;
  double dVar3;
  vector<float,_std::allocator<float>_> buf;
  allocator_type local_61;
  _Vector_base<float,_std::allocator<float>_> local_60;
  double local_48;
  undefined8 uStack_40;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_60,(ulong)size >> 2,&local_61);
  std::vector<short,_std::allocator<short>_>::resize(res,((ulong)size >> 2) + (long)offset);
  std::istream::read((char *)fin,(long)local_60._M_impl.super__Vector_impl_data._M_start);
  dVar3 = calcAbsMax<float>((TWaveformT<float> *)&local_60);
  local_48 = (double)(~-(ulong)(dVar3 != 0.0) & 0x3ff0000000000000 |
                     (ulong)(1.0 / dVar3) & -(ulong)(dVar3 != 0.0));
  uStack_40 = 0;
  psVar1 = (res->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar2 = 0;
      lVar2 < (int)((ulong)((long)local_60._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_60._M_impl.super__Vector_impl_data._M_start) >> 2);
      lVar2 = lVar2 + 1) {
    dVar3 = round((double)local_60._M_impl.super__Vector_impl_data._M_start[lVar2] * local_48 *
                  32767.0);
    psVar1[offset + lVar2] = (short)(int)dVar3;
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_60);
  return (bool)extraout_AL;
}

Assistant:

bool readWaveform(std::ifstream & fin, TWaveformT<TSample> & res, int32_t offset, std::streamsize size) {
        if (std::is_same<TSample, TSampleI16>::value) {
            std::vector<TSampleInput> buf(size/sizeof(TSampleInput));
            res.resize(offset + size/sizeof(TSampleInput));
            fin.read((char *)(buf.data()), size);
            double amax = calcAbsMax(buf);
            double iamax = amax != 0.0 ? 1.0/amax : 1.0;
            for (auto i = 0; i < (int) buf.size(); ++i) res[offset + i] = std::round(std::numeric_limits<TSampleI16>::max()*(buf[i]*iamax));
        } else if (std::is_same<TSample, TSampleF>::value) {
            res.resize(offset + size/sizeof(TSample));
            fin.read((char *)(res.data() + offset), size);
        } else {
            return false;
        }
        return true;
    }